

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

torrent_handle __thiscall
libtorrent::session_handle::add_torrent
          (session_handle *this,add_torrent_params *params,error_code *ec)

{
  bool *this_00;
  bool bVar1;
  undefined4 *in_RCX;
  error_category *peVar2;
  torrent_handle tVar3;
  reference_wrapper<boost::system::error_code> ecr;
  undefined1 local_40 [16];
  
  this_00 = &ec[0x12].failed_;
  bVar1 = info_hash_t::has_v1((info_hash_t *)this_00);
  if (bVar1) {
    peVar2 = ec->cat_;
  }
  else {
    bVar1 = info_hash_t::has_v2((info_hash_t *)this_00);
    peVar2 = ec->cat_;
    if (peVar2 == (error_category *)0x0 && !bVar1) {
      *(int *)&ec[0x13].failed_ = ec[0x12].val_;
      peVar2 = ec[0x11].cat_;
      *(undefined8 *)this_00 = *(undefined8 *)(ec + 0x11);
      *(error_category **)((long)&ec[0x12].cat_ + 4) = peVar2;
      goto LAB_00277c5e;
    }
  }
  if (peVar2 != (error_category *)0x0) {
    ::std::make_shared<libtorrent::torrent_info,libtorrent::torrent_info&>((torrent_info *)local_40)
    ;
    ::std::__shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> *)&ec->cat_,
               (__shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> *)local_40);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  }
LAB_00277c5e:
  *in_RCX = 0;
  *(undefined1 *)(in_RCX + 1) = 0;
  *(system_error_category **)(in_RCX + 2) =
       &boost::system::detail::cat_holder<void>::system_category_instance;
  tVar3 = sync_call_ret<libtorrent::torrent_handle,libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::add_torrent_params&&,boost::system::error_code&),libtorrent::add_torrent_params,std::reference_wrapper<boost::system::error_code>&>
                    (this,(offset_in_session_impl_to_subr)params,
                     (add_torrent_params *)aux::session_impl::add_torrent,
                     (reference_wrapper<boost::system::error_code> *)0x0);
  tVar3.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (torrent_handle)
         tVar3.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

torrent_handle session_handle::add_torrent(add_torrent_params&& params, error_code& ec)
	{
		TORRENT_ASSERT_PRECOND(!params.save_path.empty());

#if TORRENT_ABI_VERSION < 3
		if (!params.info_hashes.has_v1() && !params.info_hashes.has_v2() && !params.ti)
			params.info_hashes.v1 = params.info_hash;
#endif

		// the internal torrent object keeps and mutates state in the
		// torrent_info object. We can't let that leak back to the client
		if (params.ti)
			params.ti = std::make_shared<torrent_info>(*params.ti);

		ec.clear();
#if TORRENT_ABI_VERSION == 1
		handle_backwards_compatible_resume_data(params);
#endif
		auto ecr = std::ref(ec);
		return sync_call_ret<torrent_handle>(&session_impl::add_torrent, std::move(params), ecr);
	}